

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

void __thiscall hrgls::StreamProperties::StreamProperties(StreamProperties *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type mVar2;
  StreamProperties_private *__p;
  mapped_type *pmVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Rb_tree_header *p_Var5;
  hrgls_StreamProperties_ *__tmp;
  hrgls_StreamProperties ptr;
  element_type *local_30;
  key_type local_28;
  
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_private).
  super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (StreamProperties_private *)operator_new(0x40);
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__p->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5 = &(__p->m_status)._M_t._M_impl.super__Rb_tree_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
  (__p->m_status)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>::
  reset<hrgls::StreamProperties::StreamProperties_private>
            ((__shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
              *)this,__p);
  mVar2 = hrgls_StreamPropertiesCreate(&local_30);
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_28._M_thread = pthread_self();
  pmVar3 = std::
           map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
           ::operator[](&peVar1->m_status,&local_28);
  *pmVar3 = mVar2;
  peVar1 = (this->m_private).
           super___shared_ptr<hrgls::StreamProperties::StreamProperties_private,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var4->_M_use_count = 1;
  p_Var4->_M_weak_count = 1;
  p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0010ad40;
  p_Var4[1]._vptr__Sp_counted_base = (_func_int **)local_30;
  (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_30;
  this_00 = (peVar1->m_state).
            super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (peVar1->m_state).super___shared_ptr<hrgls_StreamProperties_,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var4;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

StreamProperties::StreamProperties()
  {
    // Create our private data object
    m_private.reset(new StreamProperties_private);
    hrgls_StreamProperties ptr;
    m_private->m_status[std::this_thread::get_id()] = hrgls_StreamPropertiesCreate(&ptr);
    m_private->m_state.reset(ptr,
      [](hrgls_StreamProperties_ *obj) {hrgls_StreamPropertiesDestroy(obj); }
      );
  }